

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void __thiscall
duckdb::ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>::ModeAdd
          (ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_> *this,idx_t row)

{
  DataChunk *result;
  ColumnDataScanState *state;
  size_t sVar1;
  int64_t iVar2;
  int32_t iVar3;
  reference pvVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  interval_t *piVar7;
  ulong uVar8;
  key_type *__k;
  
  state = this->scan;
  if ((state->next_row_index <= row) || (uVar5 = state->current_row_index, row < uVar5)) {
    result = &this->page;
    ColumnDataCollection::Seek(this->inputs,row,state,result);
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    this->data = (interval_t *)pvVar4->data;
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    FlatVector::VerifyFlatVector(pvVar4);
    this->validity = &pvVar4->validity;
    uVar5 = this->scan->current_row_index;
  }
  __k = this->data + (uint)((int)row - (int)uVar5);
  pmVar6 = ::std::__detail::
           _Map_base<duckdb::interval_t,_std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::interval_t>,_std::hash<duckdb::interval_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<duckdb::interval_t,_std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::interval_t>,_std::hash<duckdb::interval_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this->frequency_map,__k);
  sVar1 = pmVar6->count;
  uVar5 = sVar1 + 1;
  pmVar6->count = uVar5;
  if (sVar1 == 0) {
    this->nonzero = this->nonzero + 1;
    pmVar6->first_row = row;
  }
  else {
    uVar8 = pmVar6->first_row;
    if (row < pmVar6->first_row) {
      uVar8 = row;
    }
    pmVar6->first_row = uVar8;
  }
  if (this->count < uVar5) {
    this->valid = true;
    this->count = uVar5;
    piVar7 = this->mode;
    if (piVar7 == (interval_t *)0x0) {
      piVar7 = (interval_t *)operator_new(0x10);
      iVar3 = __k->days;
      iVar2 = __k->micros;
      piVar7->months = __k->months;
      piVar7->days = iVar3;
      piVar7->micros = iVar2;
      this->mode = piVar7;
    }
    else {
      iVar3 = __k->days;
      iVar2 = __k->micros;
      piVar7->months = __k->months;
      piVar7->days = iVar3;
      piVar7->micros = iVar2;
    }
  }
  return;
}

Assistant:

void ModeAdd(idx_t row) {
		const auto &key = GetCell(row);
		auto &attr = (*frequency_map)[key];
		auto new_count = (attr.count += 1);
		if (new_count == 1) {
			++nonzero;
			attr.first_row = row;
		} else {
			attr.first_row = MinValue(row, attr.first_row);
		}
		if (new_count > count) {
			valid = true;
			count = new_count;
			if (mode) {
				*mode = key;
			} else {
				mode = new KEY_TYPE(key);
			}
		}
	}